

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall
ON_MeshParameters::Internal_SetDoubleHelper
          (ON_MeshParameters *this,double x,double minx,double maxx,double *dest)

{
  undefined8 uVar1;
  bool bVar2;
  
  bVar2 = ON_IsValid(x);
  if (((bVar2) && (((minx == -1.23432101234321e+308 && (!NAN(minx))) || (minx <= x)))) &&
     (((maxx == -1.23432101234321e+308 && (!NAN(maxx))) || (x <= maxx)))) {
    if ((*dest != x) || (NAN(*dest) || NAN(x))) {
      *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
      *(undefined8 *)(this->m_geometry_settings_hash).m_digest =
           ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
      *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar1;
      *dest = x;
    }
  }
  return;
}

Assistant:

void ON_MeshParameters::Internal_SetDoubleHelper(double x, double minx, double maxx, double* dest)
{
  if (!ON_IsValid(x))
    return;
  if (ON_UNSET_VALUE != minx && !(x >= minx))
    return;
  if (ON_UNSET_VALUE != maxx && !(x <= maxx))
    return;
  if (x == *dest)
    return;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;
  *dest = x;
}